

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,StructMemberRef *a)

{
  Expression *parent;
  bool bVar1;
  Expression *e;
  Variable *dest;
  StructElement *source_00;
  string local_68;
  Expression *local_38;
  Expression *source;
  Type structType;
  StructMemberRef *a_local;
  HEARTGenerator *this_local;
  
  structType.structure.object = (Structure *)a;
  getStructType((Type *)&source,this,a);
  e = pool_ref::operator_cast_to_Expression_
                ((pool_ref *)((structType.structure.object)->members).space);
  local_38 = evaluateAsExpression(this,e,(Type *)&source);
  bVar1 = pool_ptr<soul::heart::Variable>::operator!=(&this->currentTargetVariable,(void *)0x0);
  if (bVar1) {
    dest = pool_ptr<soul::heart::Variable>::operator*(&this->currentTargetVariable);
    parent = local_38;
    std::__cxx11::string::string
              ((string *)&local_68,(string *)(((structType.structure.object)->members).space + 2));
    source_00 = BlockBuilder::createStructElement
                          (&(this->builder).super_BlockBuilder,parent,&local_68);
    BlockBuilder::addCastOrAssignment
              (&(this->builder).super_BlockBuilder,&dest->super_Expression,
               &source_00->super_Expression);
    std::__cxx11::string::~string((string *)&local_68);
  }
  Type::~Type((Type *)&source);
  return;
}

Assistant:

void visit (AST::StructMemberRef& a) override
    {
        auto structType = getStructType (a);
        auto& source = evaluateAsExpression (a.object, structType);

        if (currentTargetVariable != nullptr)
            builder.addCastOrAssignment (*currentTargetVariable, builder.createStructElement (source, a.memberName));
    }